

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalName *name)

{
  string local_48;
  string_view local_28;
  GlobalName *local_18;
  GlobalName *name_local;
  CWriter *this_local;
  
  local_18 = name;
  name_local = (GlobalName *)this;
  GetGlobalName(&local_48,this,name->type,name->name);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  Write(this,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CWriter::Write(const GlobalName& name) {
  Write(GetGlobalName(name.type, name.name));
}